

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

void __thiscall Imf_2_5::DwaCompressor::Classifier::Classifier(Classifier *this,char **ptr,int size)

{
  int iVar1;
  InputExc *pIVar2;
  long lVar3;
  int in_EDX;
  char *in_RSI;
  string *in_RDI;
  char value;
  char suffix [257];
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  char **in_stack_fffffffffffffe50;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  byte local_152;
  allocator<char> local_151;
  string local_150 [36];
  int local_12c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128 [8];
  int local_14;
  char *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI);
  if (local_14 < 1) {
    pIVar2 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar2,"Error uncompressing DWA data (truncated rule).");
    __cxa_throw(pIVar2,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  this_00 = local_128;
  memset(this_00,0,0x101);
  local_12c = 0xff;
  std::min<int>(&local_14,&local_12c);
  Xdr::read<Imf_2_5::CharPtrIO,char_const*>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,(char *)0x16f3e5);
  __a = &local_151;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,local_10,__a);
  std::__cxx11::string::operator=(in_RDI,local_150);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  lVar3 = std::__cxx11::string::length();
  iVar1 = Xdr::size<char>();
  if ((ulong)(long)local_14 < (ulong)(lVar3 + 1 + (long)(iVar1 << 1))) {
    pIVar2 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar2,"Error uncompressing DWA data (truncated rule).");
    __cxa_throw(pIVar2,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  Xdr::read<Imf_2_5::CharPtrIO,char_const*>
            (in_stack_fffffffffffffe50,
             (char *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  *(int *)(in_RDI + 0x28) = ((int)(char)local_152 >> 4) + -1;
  if ((*(int *)(in_RDI + 0x28) < -1) || (2 < *(int *)(in_RDI + 0x28))) {
    pIVar2 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar2,"Error uncompressing DWA data (corrupt cscIdx rule).");
    __cxa_throw(pIVar2,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  *(uint *)(in_RDI + 0x20) = (int)(char)local_152 >> 2 & 3;
  if ((-1 < *(int *)(in_RDI + 0x20)) && (*(int *)(in_RDI + 0x20) < 3)) {
    in_RDI[0x2c] = (string)(local_152 & 1);
    Xdr::read<Imf_2_5::CharPtrIO,char_const*>
              (in_stack_fffffffffffffe50,
               (char *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    if ((-1 < (char)local_152) && ((char)local_152 < '\x03')) {
      *(int *)(in_RDI + 0x24) = (int)(char)local_152;
      return;
    }
    pIVar2 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar2,"Error uncompressing DWA data (corrupt rule).");
    __cxa_throw(pIVar2,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  pIVar2 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(pIVar2,"Error uncompressing DWA data (corrupt scheme rule).");
  __cxa_throw(pIVar2,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

Classifier (const char *&ptr, int size)
    {
        if (size <= 0) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (truncated rule).");
            
        {
            // maximum length of string plus one byte for terminating NULL
            char suffix[Name::SIZE+1];
            memset (suffix, 0, Name::SIZE+1);
            Xdr::read<CharPtrIO> (ptr, std::min(size, Name::SIZE-1), suffix);
            _suffix = std::string(suffix);
        }

        if (static_cast<size_t>(size) < _suffix.length() + 1 + 2*Xdr::size<char>()) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (truncated rule).");

        char value;
        Xdr::read<CharPtrIO> (ptr, value);

        _cscIdx = (int)(value >> 4) - 1;
        if (_cscIdx < -1 || _cscIdx >= 3) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (corrupt cscIdx rule).");

        _scheme = (CompressorScheme)((value >> 2) & 3);
        if (_scheme < 0 || _scheme >= NUM_COMPRESSOR_SCHEMES) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (corrupt scheme rule).");

        _caseInsensitive = (value & 1 ? true : false);

        Xdr::read<CharPtrIO> (ptr, value);
        if (value < 0 || value >= NUM_PIXELTYPES) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (corrupt rule).");
        _type = (PixelType)value;
    }